

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_envelope_eval.cxx
# Opt level: O0

float outgoing(xr_key *key0_prev,xr_key *key0,xr_key *key1)

{
  float fVar1;
  float extraout_XMM0_Da;
  float local_34;
  float out;
  float t;
  float d;
  float b;
  float a;
  xr_key *key1_local;
  xr_key *key0_local;
  xr_key *key0_prev_local;
  
  switch(key0->shape) {
  case '\0':
    local_34 = (1.0 - key0->tension) * (1.0 - key0->continuity) * (1.0 - key0->bias);
    fVar1 = key1->value - key0->value;
    if (key0_prev == (xr_key *)0x0) {
      local_34 = local_34 * fVar1;
    }
    else {
      local_34 = ((key1->time - key0->time) / (key1->time - key0_prev->time)) *
                 ((1.0 - key0->tension) * (key0->continuity + 1.0) * (key0->bias + 1.0) *
                  (key0->value - key0_prev->value) + local_34 * fVar1);
    }
    break;
  case '\x01':
  case '\x02':
    local_34 = key0->param[1];
    if (key0_prev != (xr_key *)0x0) {
      local_34 = ((key1->time - key0->time) / (key1->time - key0_prev->time)) * local_34;
    }
    break;
  case '\x03':
    local_34 = key1->value - key0->value;
    if (key0_prev != (xr_key *)0x0) {
      local_34 = ((key1->time - key0->time) / (key1->time - key0_prev->time)) *
                 ((key0->value - key0_prev->value) + local_34);
    }
    break;
  case '\x04':
  default:
    local_34 = 0.0;
    break;
  case '\x05':
    local_34 = key0->param[3] * (key1->time - key0->time);
    std::abs((int)key0_prev);
    if (extraout_XMM0_Da <= 1e-05) {
      local_34 = local_34 * 100000.0;
    }
    else {
      local_34 = local_34 / key0->param[2];
    }
  }
  return local_34;
}

Assistant:

static float outgoing(const xr_key* key0_prev, const xr_key* key0, const xr_key* key1)
{
	float a, b, d, t, out;
	switch (key0->shape) {
	case xr_key::SHAPE_TCB:
		a = (1.f - key0->tension)*(1.f + key0->continuity)*(1.f + key0->bias);
		b = (1.f - key0->tension)*(1.f - key0->continuity)*(1.f - key0->bias);
		d = key1->value - key0->value;
		if (key0_prev) {
			t = (key1->time - key0->time)/(key1->time - key0_prev->time);
			out = t*(a*(key0->value - key0_prev->value) + b*d);
		} else {
			out = b*d;
		}
		break;

	case xr_key::SHAPE_LINE:
		d = key1->value - key0->value;
		if (key0_prev) {
			t = (key1->time - key0->time)/(key1->time - key0_prev->time);
			out = t*(key0->value - key0_prev->value + d);
		} else {
			out = d;
		}
		break;

	case xr_key::SHAPE_BEZI:
	case xr_key::SHAPE_HERM:
		out = key0->param[1];
		if (key0_prev)
			out *= (key1->time - key0->time)/(key1->time - key0_prev->time);
		break;

	case xr_key::SHAPE_BEZ2:
		out = key0->param[3]*(key1->time - key0->time);
		if (std::abs(key0->param[2]) > 1e-5f)
			out /= key0->param[2];
		else
			out *= 1e+5f;
		break;

	case xr_key::SHAPE_STEP:
	default:
		out = 0.f;
		break;
	}
	return out;
}